

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O3

Mat * filter_arrow(Mat *img,array<cv::Mat,_5UL> *target_filled,bool debug)

{
  _InputArray *p_Var1;
  char in_CL;
  undefined7 in_register_00000011;
  long lVar2;
  int in_R8D;
  char *__end;
  char *__end_2;
  array<cv::Mat,_4UL> colours;
  Mat *local_768;
  Mat *pMStack_760;
  Size local_758;
  undefined8 uStack_750;
  Mat local_6f8 [96];
  Mat aMStack_698 [144];
  undefined8 local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  _InputArray local_5b8 [4];
  long *local_558;
  Mat *pMStack_550;
  Size local_548;
  undefined8 uStack_540;
  Mat local_4e8 [96];
  Mat aMStack_488 [152];
  _InputArray local_3f0 [4];
  undefined1 local_390 [16];
  Size local_380;
  Mat local_320 [96];
  Mat aMStack_2c0 [144];
  _OutputArray local_230 [4];
  Mat local_1d0 [96];
  Mat local_170 [96];
  Mat local_110 [96];
  undefined1 local_b0 [96];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_50 = 0x406fe00000000000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  filter_yellow((Mat *)local_5b8);
  cv::operator-((Scalar_ *)&local_768,(Mat *)&local_50);
  cv::Mat::Mat(local_1d0);
  (**(code **)(*(long *)local_768 + 0x18))(local_768,(_InputArray *)&local_768,local_1d0,0xffffffff)
  ;
  local_5e8 = 0x406fe00000000000;
  local_5e0 = 0;
  uStack_5d8 = 0;
  local_5d0 = 0;
  filter_red((Mat *)local_3f0);
  cv::operator-((Scalar_ *)&local_558,(Mat *)&local_5e8);
  cv::Mat::Mat(local_170);
  (**(code **)(*local_558 + 0x18))(local_558,(_InputArray *)&local_558,local_170,0xffffffff);
  local_608 = 0x406fe00000000000;
  local_600 = 0;
  uStack_5f8 = 0;
  local_5f0 = 0;
  filter_blue((Mat *)local_230);
  cv::operator-((Scalar_ *)local_390,(Mat *)&local_608);
  cv::Mat::Mat(local_110);
  (**(code **)(*(long *)CONCAT44(local_390._4_4_,local_390._0_4_) + 0x18))
            ((long *)CONCAT44(local_390._4_4_,local_390._0_4_),local_390,local_110);
  cv::Mat::clone();
  cv::Mat::~Mat(aMStack_2c0);
  cv::Mat::~Mat(local_320);
  cv::Mat::~Mat((Mat *)(local_390 + 0x10));
  cv::Mat::~Mat((Mat *)local_230);
  cv::Mat::~Mat(aMStack_488);
  cv::Mat::~Mat(local_4e8);
  cv::Mat::~Mat((Mat *)&local_548);
  cv::Mat::~Mat((Mat *)local_3f0);
  cv::Mat::~Mat(aMStack_698);
  cv::Mat::~Mat(local_6f8);
  cv::Mat::~Mat((Mat *)&local_758);
  cv::Mat::~Mat((Mat *)local_5b8);
  local_758.width = 0;
  local_758.height = 0;
  local_768 = (Mat *)CONCAT44(local_768._4_4_,0x1010000);
  local_548.width = 0;
  local_548.height = 0;
  local_558 = (long *)CONCAT44(local_558._4_4_,0x2010000);
  pMStack_760 = (Mat *)local_b0;
  pMStack_550 = (Mat *)local_b0;
  cv::cvtColor((cv *)&local_768,(_InputArray *)&local_558,(_OutputArray *)0x43,0,in_R8D);
  local_380.width = 0;
  local_380.height = 0;
  local_390._0_4_ = 0x1010000;
  local_758.width = 0;
  local_758.height = 0;
  uStack_750 = 0;
  local_768 = (Mat *)0x0;
  pMStack_760 = (Mat *)0x0;
  local_5b8[0].flags = -0x3efdfffa;
  local_5b8[0].sz.width = 1;
  local_5b8[0].sz.height = 4;
  local_558 = (long *)0x406fe00000000000;
  pMStack_550 = (Mat *)0x4061800000000000;
  local_548.width = 0;
  local_548.height = 0x40540000;
  uStack_540 = 0;
  local_3f0[0].flags = -0x3efdfffa;
  local_3f0[0].sz.width = 1;
  local_3f0[0].sz.height = 4;
  local_230[0].super__InputArray.sz.width = 0;
  local_230[0].super__InputArray.sz.height = 0;
  local_230[0].super__InputArray.flags = 0x2010000;
  local_5b8[0].obj = (_InputArray *)&local_768;
  local_3f0[0].obj = (_InputArray *)&local_558;
  local_390._8_8_ = local_b0;
  local_230[0].super__InputArray.obj = local_b0;
  cv::inRange((_InputArray *)local_390,local_5b8,local_3f0,local_230);
  if (in_CL != '\0') {
    lVar2 = 0;
    do {
      local_768 = (Mat *)&local_758;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"black_layer","");
      cv::namedWindow((string *)&local_768,0);
      if ((Size *)local_768 != &local_758) {
        operator_delete(local_768,(long)local_758 + 1);
      }
      local_768 = (Mat *)&local_758;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"black_layer","");
      pMStack_550 = local_1d0 + lVar2;
      local_548.width = 0;
      local_548.height = 0;
      local_558 = (long *)CONCAT44(local_558._4_4_,0x1010000);
      cv::imshow((string *)&local_768,(_InputArray *)&local_558);
      if ((Size *)local_768 != &local_758) {
        operator_delete(local_768,(long)local_758 + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      lVar2 = lVar2 + 0x60;
    } while (lVar2 != 0x180);
  }
  lVar2 = 0;
  do {
    pMStack_760 = local_1d0 + lVar2;
    local_758.width = 0;
    local_758.height = 0;
    local_768 = (Mat *)CONCAT44(local_768._4_4_,0x1010000);
    pMStack_550 = (Mat *)(CONCAT71(in_register_00000011,debug) + lVar2);
    local_548.width = 0;
    local_548.height = 0;
    local_558 = (long *)CONCAT44(local_558._4_4_,0x1010000);
    local_380.width = 0;
    local_380.height = 0;
    local_390._0_4_ = 0x2010000;
    local_390._8_8_ = pMStack_760;
    p_Var1 = (_InputArray *)cv::noArray();
    cv::bitwise_and((_InputArray *)&local_768,(_InputArray *)&local_558,(_OutputArray *)local_390,
                    p_Var1);
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x120);
  if (in_CL != '\0') {
    lVar2 = 0;
    do {
      local_768 = (Mat *)&local_758;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"cleaned black_layer","")
      ;
      cv::namedWindow((string *)&local_768,0);
      if ((Size *)local_768 != &local_758) {
        operator_delete(local_768,(long)local_758 + 1);
      }
      local_768 = (Mat *)&local_758;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"cleaned black_layer","")
      ;
      pMStack_550 = local_1d0 + lVar2;
      local_548.width = 0;
      local_548.height = 0;
      local_558 = (long *)CONCAT44(local_558._4_4_,0x1010000);
      cv::imshow((string *)&local_768,(_InputArray *)&local_558);
      if ((Size *)local_768 != &local_758) {
        operator_delete(local_768,(long)local_758 + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      lVar2 = lVar2 + 0x60;
    } while (lVar2 != 0x180);
  }
  lVar2 = 0x60;
  do {
    local_758.width = 0;
    local_758.height = 0;
    local_768 = (Mat *)CONCAT44(local_768._4_4_,0x1010000);
    pMStack_550 = local_1d0 + lVar2;
    local_548.width = 0;
    local_548.height = 0;
    local_558 = (long *)CONCAT44(local_558._4_4_,0x1010000);
    local_380.width = 0;
    local_380.height = 0;
    local_390._0_4_ = 0x2010000;
    pMStack_760 = local_1d0;
    local_390._8_8_ = local_1d0;
    p_Var1 = (_InputArray *)cv::noArray();
    cv::bitwise_or((_InputArray *)&local_768,(_InputArray *)&local_558,(_OutputArray *)local_390,
                   p_Var1);
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x180);
  local_380.width = 0;
  local_380.height = 0;
  local_390._0_4_ = 0x1010000;
  local_5b8[0].sz.width = 0;
  local_5b8[0].sz.height = 0;
  local_5b8[0].flags = 0x2010000;
  local_5b8[0].obj = local_1d0;
  local_390._8_8_ = local_1d0;
  cv::Mat::Mat((Mat *)&local_768);
  local_3f0[0].sz.width = 0;
  local_3f0[0].sz.height = 0;
  local_3f0[0].flags = 0x1010000;
  local_5c0 = 0xffffffffffffffff;
  local_558 = (long *)0x7fefffffffffffff;
  pMStack_550 = (Mat *)0x7fefffffffffffff;
  local_548.width = -1;
  local_548.height = 0x7fefffff;
  uStack_540 = 0x7fefffffffffffff;
  local_3f0[0].obj = (_InputArray *)&local_768;
  cv::erode(local_390,local_5b8,local_3f0,&local_5c0,4,0,(_InputArray *)&local_558);
  cv::Mat::~Mat((Mat *)&local_768);
  local_380.width = 0;
  local_380.height = 0;
  local_390._0_4_ = 0x1010000;
  local_5b8[0].sz.width = 0;
  local_5b8[0].sz.height = 0;
  local_5b8[0].flags = 0x2010000;
  local_5b8[0].obj = local_1d0;
  local_390._8_8_ = local_1d0;
  cv::Mat::Mat((Mat *)&local_768,8,8,0);
  local_3f0[0].sz.width = 0;
  local_3f0[0].sz.height = 0;
  local_3f0[0].flags = 0x1010000;
  local_5c8 = 0xffffffffffffffff;
  local_558 = (long *)0x7fefffffffffffff;
  pMStack_550 = (Mat *)0x7fefffffffffffff;
  local_548.width = -1;
  local_548.height = 0x7fefffff;
  uStack_540 = 0x7fefffffffffffff;
  local_3f0[0].obj = (_InputArray *)&local_768;
  cv::dilate(local_390,local_5b8,local_3f0,&local_5c8,8,0,(_InputArray *)&local_558);
  cv::Mat::~Mat((Mat *)&local_768);
  cv::Mat::Mat(img,local_1d0);
  lVar2 = 0x120;
  do {
    cv::Mat::~Mat(local_1d0 + lVar2);
    lVar2 = lVar2 + -0x60;
  } while (lVar2 != -0x60);
  return img;
}

Assistant:

cv::Mat filter_arrow(const cv::Mat& img, const std::array<cv::Mat, 5>& target_filled, bool debug)
{
    std::array<cv::Mat, 4> colours {
        255 - filter_yellow(img), 255 - filter_red(img), 255 - filter_blue(img), img.clone()};
    cv::cvtColor(colours[3], colours[3], cv::COLOR_RGB2HSV_FULL);
    cv::inRange(colours[3], cv::Scalar(0, 0, 0), cv::Scalar(255, 140, 80), colours[3]);

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("black_layer", cv::WINDOW_NORMAL);
            cv::imshow("black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }
    assert(colours.size() > 3 && target_filled.size() >= colours.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        cv::bitwise_and(colours[i], target_filled[i], colours[i]);
    }

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("cleaned black_layer", cv::WINDOW_NORMAL);
            cv::imshow("cleaned black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }

    for(std::size_t i = 1; i < colours.size(); i++)
    {
        cv::bitwise_or(colours[0], colours[i], colours[0]);
    }

    cv::erode(colours[0], colours[0], cv::Mat(), cv::Point(-1, -1), 4);
    cv::dilate(colours[0], colours[0], cv::Mat(8, 8, 0), cv::Point(-1, -1), 8);

    return colours[0];
}